

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O0

plutovg_gradient_paint_t *
plutovg_gradient_create
          (plutovg_gradient_type_t type,plutovg_spread_method_t spread,
          plutovg_gradient_stop_t *stops,int nstops,plutovg_matrix_t *matrix)

{
  float *pfVar1;
  float fVar2;
  plutovg_gradient_paint_t *ppVar3;
  plutovg_matrix_t *ppVar4;
  plutovg_gradient_stop_t *ppVar5;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  plutovg_gradient_stop_t *stop;
  int i;
  float prev_offset;
  plutovg_gradient_paint_t *gradient;
  plutovg_matrix_t *matrix_local;
  int nstops_local;
  plutovg_gradient_stop_t *stops_local;
  plutovg_spread_method_t spread_local;
  plutovg_gradient_type_t type_local;
  
  ppVar3 = (plutovg_gradient_paint_t *)
           plutovg_paint_create(PLUTOVG_PAINT_TYPE_GRADIENT,(long)nstops * 0x14 + 0x50);
  ppVar3->type = type;
  ppVar3->spread = spread;
  ppVar4 = &ppVar3->matrix;
  if (matrix == (plutovg_matrix_t *)0x0) {
    ppVar4->a = 1.0;
    ppVar4->b = 0.0;
    (ppVar3->matrix).c = 0.0;
    (ppVar3->matrix).d = 1.0;
    (ppVar3->matrix).e = 0.0;
    (ppVar3->matrix).f = 0.0;
  }
  else {
    fVar2 = matrix->b;
    ppVar4->a = matrix->a;
    ppVar4->b = fVar2;
    fVar2 = matrix->d;
    (ppVar3->matrix).c = matrix->c;
    (ppVar3->matrix).d = fVar2;
    fVar2 = matrix->f;
    (ppVar3->matrix).e = matrix->e;
    (ppVar3->matrix).f = fVar2;
  }
  ppVar3->stops = (plutovg_gradient_stop_t *)(ppVar3 + 1);
  ppVar3->nstops = nstops;
  stop._4_4_ = 0.0;
  for (stop._0_4_ = 0; (int)stop < nstops; stop._0_4_ = (int)stop + 1) {
    ppVar5 = stops + (int)stop;
    if (0.0 < ppVar5->offset || ppVar5->offset == 0.0) {
      if (ppVar5->offset <= 1.0) {
        local_6c = ppVar5->offset;
      }
      else {
        local_6c = 1.0;
      }
      local_68 = local_6c;
    }
    else {
      local_68 = 0.0;
    }
    if (stop._4_4_ <= local_68) {
      if (0.0 < ppVar5->offset || ppVar5->offset == 0.0) {
        if (ppVar5->offset <= 1.0) {
          local_78 = ppVar5->offset;
        }
        else {
          local_78 = 1.0;
        }
        local_74 = local_78;
      }
      else {
        local_74 = 0.0;
      }
      local_70 = local_74;
    }
    else {
      local_70 = stop._4_4_;
    }
    ppVar3->stops[(int)stop].offset = local_70;
    if (0.0 < (ppVar5->color).r || (ppVar5->color).r == 0.0) {
      if ((ppVar5->color).r <= 1.0) {
        local_80 = (ppVar5->color).r;
      }
      else {
        local_80 = 1.0;
      }
      local_7c = local_80;
    }
    else {
      local_7c = 0.0;
    }
    ppVar3->stops[(int)stop].color.r = local_7c;
    pfVar1 = &(ppVar5->color).g;
    if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
      if ((ppVar5->color).g <= 1.0) {
        local_88 = (ppVar5->color).g;
      }
      else {
        local_88 = 1.0;
      }
      local_84 = local_88;
    }
    else {
      local_84 = 0.0;
    }
    ppVar3->stops[(int)stop].color.g = local_84;
    pfVar1 = &(ppVar5->color).b;
    if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
      if ((ppVar5->color).b <= 1.0) {
        local_90 = (ppVar5->color).b;
      }
      else {
        local_90 = 1.0;
      }
      local_8c = local_90;
    }
    else {
      local_8c = 0.0;
    }
    ppVar3->stops[(int)stop].color.b = local_8c;
    pfVar1 = &(ppVar5->color).a;
    if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
      if ((ppVar5->color).a <= 1.0) {
        local_98 = (ppVar5->color).a;
      }
      else {
        local_98 = 1.0;
      }
      local_94 = local_98;
    }
    else {
      local_94 = 0.0;
    }
    ppVar3->stops[(int)stop].color.a = local_94;
    stop._4_4_ = ppVar3->stops[(int)stop].offset;
  }
  return ppVar3;
}

Assistant:

static plutovg_gradient_paint_t* plutovg_gradient_create(plutovg_gradient_type_t type, plutovg_spread_method_t spread, const plutovg_gradient_stop_t* stops, int nstops, const plutovg_matrix_t* matrix)
{
    plutovg_gradient_paint_t* gradient = plutovg_paint_create(PLUTOVG_PAINT_TYPE_GRADIENT, sizeof(plutovg_gradient_paint_t) + nstops * sizeof(plutovg_gradient_stop_t));
    gradient->type = type;
    gradient->spread = spread;
    gradient->matrix = matrix ? *matrix : PLUTOVG_IDENTITY_MATRIX;
    gradient->stops = (plutovg_gradient_stop_t*)(gradient + 1);
    gradient->nstops = nstops;

    float prev_offset = 0.f;
    for(int i = 0; i < nstops; ++i) {
        const plutovg_gradient_stop_t* stop = stops + i;
        gradient->stops[i].offset = plutovg_max(prev_offset, plutovg_clamp(stop->offset, 0.f, 1.f));
        gradient->stops[i].color.r = plutovg_clamp(stop->color.r, 0.f, 1.f);
        gradient->stops[i].color.g = plutovg_clamp(stop->color.g, 0.f, 1.f);
        gradient->stops[i].color.b = plutovg_clamp(stop->color.b, 0.f, 1.f);
        gradient->stops[i].color.a = plutovg_clamp(stop->color.a, 0.f, 1.f);
        prev_offset = gradient->stops[i].offset;
    }

    return gradient;
}